

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

bool libtorrent::anon_unknown_1::extract_files2
               (bdecode_node *tree,file_storage *target,string *root_dir,ptrdiff_t info_offset,
               char *info_buffer,bool has_files,int depth,error_code *ec)

{
  pointer pcVar1;
  string_view symlink_path_00;
  void *pvVar2;
  size_t sVar3;
  file_flags_t file_flags;
  byte bVar4;
  bool bVar5;
  type_t tVar6;
  int iVar7;
  int iVar8;
  ptrdiff_t pVar9;
  char *pcVar10;
  error_code *peVar11;
  bdecode_node *this;
  char *root_hash;
  undefined7 in_register_00000089;
  error_code *__s2;
  string *path_00;
  bool bVar12;
  string_view key;
  string_view key_00;
  error_code eVar13;
  string_view sVar14;
  string_view key_01;
  string_view element;
  string_view key_02;
  string_view filename;
  string path;
  string symlink_path;
  bdecode_node s_p;
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> e;
  ulong local_210;
  string local_208;
  error_code *local_1e8;
  char *local_1e0;
  bdecode_node *local_1d8;
  int local_1cc;
  int local_1c8;
  undefined4 local_1c4;
  bdecode_token *local_1c0;
  pointer local_1b8;
  bdecode_token local_1b0 [2];
  file_storage *local_1a0;
  bdecode_node local_198;
  int64_t local_158;
  string *local_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_148;
  bdecode_node local_f8;
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> local_b0;
  
  local_1e8 = (error_code *)info_offset;
  local_1e0 = info_buffer;
  local_1d8 = tree;
  local_150 = root_dir;
  tVar6 = bdecode_node::type(tree);
  this = local_1d8;
  if (tVar6 == dict_t) {
    if (depth < 0x65) {
      iVar7 = bdecode_node::dict_size(local_1d8);
      pcVar10 = (char *)CONCAT71((int7)((ulong)info_offset >> 8),1);
      if (0 < iVar7) {
        local_1c4 = (undefined4)CONCAT71(in_register_00000089,has_files);
        local_1c8 = depth + 1;
        iVar7 = 0;
        local_1a0 = target;
        do {
          bdecode_node::dict_at_node(&local_b0,this,iVar7);
          tVar6 = bdecode_node::type(&local_b0.second);
          if ((tVar6 == dict_t) &&
             (sVar14 = bdecode_node::string_value(&local_b0.first), sVar14._M_len != 0)) {
            pVar9 = bdecode_node::string_offset(&local_b0.first);
            iVar8 = bdecode_node::string_length(&local_b0.first);
            __s2 = (error_code *)(local_1e0 + (pVar9 - (long)local_1e8));
            if (iVar8 != 0) {
              path_00 = (string *)(long)iVar8;
              do {
                if ((char)__s2->val_ != '/') goto LAB_003680ec;
                __s2 = (error_code *)((long)&__s2->val_ + 1);
                path_00 = (string *)((long)&path_00[-1].field_2 + 0xf);
              } while (path_00 != (string *)0x0);
            }
            path_00 = (string *)0x0;
LAB_003680ec:
            iVar8 = bdecode_node::dict_size(&local_b0.second);
            if (iVar8 == 1) {
              bdecode_node::dict_at(&local_148,&local_b0.second,0);
              sVar3 = local_148.first._M_len;
              bVar12 = (undefined1 *)local_148.first._M_len == (undefined1 *)0x0;
              if (local_148.second.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_148.second.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_148.second.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_148.second.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (((undefined1 *)sVar3 != (undefined1 *)0x0 || (char)local_1c4 != '\0') ||
                 (iVar8 = bdecode_node::dict_size(local_1d8), iVar8 != 1)) goto LAB_003681a6;
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              local_208._M_string_length = 0;
              local_208.field_2._M_local_buf[0] = '\0';
            }
            else {
              bVar12 = false;
LAB_003681a6:
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              pcVar1 = (local_150->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_208,pcVar1,pcVar1 + local_150->_M_string_length);
            }
            sVar14._M_str = pcVar10;
            sVar14._M_len = (size_t)__s2;
            aux::sanitize_append_path_element((aux *)&local_208,path_00,sVar14);
            if (bVar12) {
              if (local_208._M_string_length < path_00) {
LAB_00368259:
                __s2 = (error_code *)0x0;
                path_00 = (string *)0x0;
              }
              else {
                pcVar10 = (char *)0xffffffffffffffff;
                ::std::__cxx11::string::substr((ulong)&local_148,(ulong)&local_208);
                sVar3 = local_148.first._M_len;
                bVar12 = true;
                if (((string *)local_148.first._M_str == path_00) &&
                   ((path_00 == (string *)0x0 ||
                    (iVar8 = bcmp((void *)local_148.first._M_len,__s2,(size_t)path_00), iVar8 == 0))
                   )) {
                  bVar12 = false;
                }
                if ((bdecode_node *)sVar3 != &local_148.second) {
                  operator_delete((void *)sVar3,
                                  (ulong)&(local_148.second.m_tokens.
                                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->field_0x1);
                }
                if (bVar12) goto LAB_00368259;
              }
              bdecode_node::dict_at(&local_148,&local_b0.second,0);
              tVar6 = bdecode_node::type(&local_148.second);
              bVar4 = 1;
              if (tVar6 == dict_t) {
                file_flags = get_file_attributes(&local_148.second);
                if ((file_flags.m_val & 1) == 0) {
                  if ((file_flags.m_val & 8) == 0) {
                    key._M_str = "length";
                    key._M_len = 6;
                    local_210 = bdecode_node::dict_find_int_value(&local_148.second,key,-1);
                    if (0x3ffffffe < local_210 >> 0xe) {
                      eVar13 = errors::make_error_code(torrent_invalid_length);
                      goto LAB_00368347;
                    }
                  }
                  else {
                    local_210 = 0;
                  }
                  key_00._M_str = "mtime";
                  key_00._M_len = 5;
                  local_158 = bdecode_node::dict_find_int_value(&local_148.second,key_00,0);
                  local_1c0 = local_1b0;
                  local_1b8 = (pointer)0x0;
                  local_1b0[0]._0_1_ = 0;
                  if ((file_flags.m_val & 8) == 0) {
LAB_003684e9:
                    if (local_210 == 0 || local_1b8 != (pointer)0x0) {
                      root_hash = (char *)0x0;
                    }
                    else {
                      key_02._M_str = "pieces root";
                      key_02._M_len = 0xb;
                      pcVar10 = "pieces root";
                      bdecode_node::dict_find_string(&local_198,&local_148.second,key_02);
                      bVar12 = bdecode_node::operator_cast_to_bool(&local_198);
                      if ((bVar12) && (tVar6 = bdecode_node::type(&local_198), tVar6 == string_t)) {
                        iVar8 = bdecode_node::string_length(&local_198);
                        if (iVar8 != 0x20) goto LAB_00368589;
                        pVar9 = bdecode_node::string_offset(&local_198);
                        root_hash = local_1e0 + (pVar9 - (long)local_1e8);
                        if (local_1e0 == (char *)0x0) {
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_f8.m_root_tokens = (bdecode_token *)0x0;
                        }
                        else {
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)root_hash
                          ;
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                               *(undefined4 *)(root_hash + 4);
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                               *(undefined4 *)(root_hash + 8);
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                               *(undefined4 *)(root_hash + 0xc);
                          local_f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               *(pointer *)(root_hash + 0x10);
                          local_f8.m_root_tokens = *(bdecode_token **)(root_hash + 0x18);
                        }
                        bVar5 = digest32<256L>::is_all_zeros((digest32<256L> *)&local_f8);
                        bVar12 = true;
                        if (bVar5) {
                          boost::system::error_code::operator=(ec,torrent_missing_pieces_root);
                          goto LAB_003685a4;
                        }
                      }
                      else {
LAB_00368589:
                        eVar13 = errors::make_error_code(torrent_missing_pieces_root);
                        ec->val_ = eVar13.val_;
                        ec->failed_ = eVar13.failed_;
                        *(int3 *)&ec->field_0x5 = eVar13._5_3_;
                        ec->cat_ = eVar13.cat_;
                        root_hash = (char *)0x0;
                        pcVar10 = (char *)ec;
LAB_003685a4:
                        bVar12 = false;
                      }
                      if (local_198.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_198.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_198.m_tokens.
                                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_198.m_tokens.
                                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      bVar4 = 1;
                      if (!bVar12) goto LAB_00368649;
                    }
                    local_198.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish = local_1c0;
                    symlink_path_00._M_str = (char *)local_1c0;
                    symlink_path_00._M_len = (size_t)local_1b8;
                    filename._M_str = (char *)__s2;
                    filename._M_len = (size_t)path_00;
                    local_198.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start = local_1b8;
                    file_storage::add_file_borrow
                              (local_1a0,ec,filename,&local_208,local_210,file_flags,local_158,
                               symlink_path_00,root_hash);
                    bVar4 = (ec->failed_ ^ 1U) * '\x03' + 1;
                    pcVar10 = (char *)__s2;
                  }
                  else {
                    key_01._M_str = "symlink path";
                    key_01._M_len = 0xc;
                    bdecode_node::dict_find_list(&local_198,&local_148.second,key_01);
                    bVar12 = bdecode_node::operator_cast_to_bool(&local_198);
                    if (!bVar12) {
LAB_003684c4:
                      if (local_198.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_198.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_198.m_tokens.
                                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_198.m_tokens.
                                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      goto LAB_003684e9;
                    }
                    path_length(&local_198,ec);
                    if (ec->failed_ == false) {
                      peVar11 = ec;
                      ::std::__cxx11::string::reserve((ulong)&local_1c0);
                      local_1cc = bdecode_node::list_size(&local_198);
                      if (0 < local_1cc) {
                        iVar8 = 0;
                        do {
                          bdecode_node::list_at(&local_f8,&local_198,iVar8);
                          sVar14 = bdecode_node::string_value(&local_f8);
                          element._M_len = sVar14._M_str;
                          pvVar2 = (void *)CONCAT44(local_f8.m_tokens.
                                                                                                        
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_f8.m_tokens.
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_);
                          if (pvVar2 != (void *)0x0) {
                            operator_delete(pvVar2,(long)local_f8.m_tokens.
                                                                                                                  
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)pvVar2);
                          }
                          element._M_str = (char *)peVar11;
                          aux::sanitize_append_path_element
                                    ((aux *)&local_1c0,(string *)sVar14._M_len,element);
                          iVar8 = iVar8 + 1;
                        } while (local_1cc != iVar8);
                      }
                      goto LAB_003684c4;
                    }
                    pcVar10 = (char *)ec;
                    if (local_198.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_198.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_198.m_tokens.
                                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_198.m_tokens.
                                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    bVar4 = 1;
                  }
LAB_00368649:
                  if (local_1c0 != local_1b0) {
                    operator_delete(local_1c0,CONCAT71(local_1b0[0]._1_7_,local_1b0[0]._0_1_) + 1);
                  }
                }
                else {
                  eVar13 = errors::make_error_code(torrent_invalid_pad_file);
LAB_00368347:
                  ec->val_ = eVar13.val_;
                  ec->failed_ = eVar13.failed_;
                  *(int3 *)&ec->field_0x5 = eVar13._5_3_;
                  ec->cat_ = eVar13.cat_;
                  pcVar10 = (char *)ec;
                }
              }
              if (local_148.second.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_148.second.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_148.second.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_148.second.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              pcVar10 = (char *)local_1e8;
              bVar12 = extract_files2(&local_b0.second,local_1a0,&local_208,(ptrdiff_t)local_1e8,
                                      local_1e0,true,local_1c8,ec);
              bVar4 = !bVar12;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,
                              CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                       local_208.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            eVar13 = errors::make_error_code(torrent_file_parse_failed);
            ec->val_ = eVar13.val_;
            ec->failed_ = eVar13.failed_;
            *(int3 *)&ec->field_0x5 = eVar13._5_3_;
            ec->cat_ = eVar13.cat_;
            bVar4 = 1;
            pcVar10 = (char *)ec;
          }
          if (local_b0.second.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.second.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.second.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.first.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.first.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.first.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.first.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          this = local_1d8;
          if ((bVar4 & 3) != 0) goto LAB_00368029;
          iVar7 = iVar7 + 1;
          iVar8 = bdecode_node::dict_size(local_1d8);
        } while (iVar7 < iVar8);
        pcVar10 = (char *)0x1;
      }
      goto LAB_0036802b;
    }
    eVar13 = errors::make_error_code(torrent_file_parse_failed);
  }
  else {
    eVar13 = errors::make_error_code(torrent_file_parse_failed);
  }
  ec->val_ = eVar13.val_;
  ec->failed_ = eVar13.failed_;
  *(int3 *)&ec->field_0x5 = eVar13._5_3_;
  ec->cat_ = eVar13.cat_;
LAB_00368029:
  pcVar10 = (char *)0x0;
LAB_0036802b:
  return SUB81(pcVar10,0);
}

Assistant:

bool extract_files2(bdecode_node const& tree, file_storage& target
		, std::string const& root_dir, ptrdiff_t const info_offset
		, char const* info_buffer
		, bool const has_files, int const depth, error_code& ec)
	{
		if (tree.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		// since we're parsing this recursively, we have to be careful not to blow
		// up the stack. 100 levels of sub directories should be enough. This
		// could be improved by an iterative parser, keeping the state on a more
		// compact side-stack
		if (depth > 100)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		for (int i = 0; i < tree.dict_size(); ++i)
		{
			auto e = tree.dict_at_node(i);
			if (e.second.type() != bdecode_node::dict_t || e.first.string_value().empty())
			{
				ec = errors::torrent_file_parse_failed;
				return false;
			}

			string_view filename = { info_buffer + (e.first.string_offset() - info_offset)
				, static_cast<size_t>(e.first.string_length()) };
			while (!filename.empty() && filename.front() == TORRENT_SEPARATOR)
				filename.remove_prefix(1);

			bool const leaf_node = e.second.dict_size() == 1 && e.second.dict_at(0).first.empty();
			bool const single_file = leaf_node && !has_files && tree.dict_size() == 1;

			std::string path = single_file ? std::string() : root_dir;
			aux::sanitize_append_path_element(path, filename);

			if (leaf_node)
			{
				if (filename.size() > path.length()
					|| path.substr(path.size() - filename.size()) != filename)
				{
					// if the filename was sanitized and differ, clear it to just use path
					filename = {};
				}

				if (!extract_single_file2(e.second.dict_at(0).second, target
					, path, filename, info_offset, info_buffer, ec))
				{
					return false;
				}
				continue;
			}

			if (!extract_files2(e.second, target, path, info_offset, info_buffer
				, true, depth + 1, ec))
			{
				return false;
			}
		}

		return true;
	}